

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.hpp
# Opt level: O2

optional<int32_t> __thiscall Command::Arg::find_constant(Arg *this,string_view *value)

{
  value_type *pvVar1;
  shared_ptr<Enum> *e;
  value_type *pvVar2;
  
  pvVar2 = (value_type *)value->__size;
  pvVar1 = value[1].__data;
  do {
    if (pvVar2 == pvVar1) {
      this->type = Param;
      *(undefined1 *)&this->entity_type = 0;
      return (optional<int32_t>)(OptionalBase<int>)this;
    }
    Enum::find((Enum *)this,*(string_view **)pvVar2);
    pvVar2 = pvVar2 + 0x10;
  } while (this->type == Param);
  return (optional<int32_t>)(OptionalBase<int>)this;
}

Assistant:

::optional<int32_t> find_constant(const string_view& value) const
        {
            for(auto& e : enums)
            {
                if(auto opt = e->find(value))
                    return opt;
            }
            return nullopt;
        }